

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O2

void __thiscall Block::show_link(Block *this,ProxyWithLink *cp)

{
  Link *pLVar1;
  ostream *poVar2;
  
  pLVar1 = cp->link_;
  poVar2 = std::operator<<((ostream *)&std::cout,"Block (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(cp->super_Proxy).gid_);
  poVar2 = std::operator<<(poVar2,"): ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[3].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[3].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      pLVar1[3].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[5].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[5].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      pLVar1[5].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[7].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[7].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      pLVar1[7].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[9].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (pLVar1[9].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      pLVar1[9].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      (int)((ulong)((long)(pLVar1->neighbors_).
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pLVar1->neighbors_).
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  poVar2 = std::operator<<(poVar2,' ');
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void show_link(const diy::Master::ProxyWithLink& cp)
    {
      diy::RegularLink<Bounds>* link = static_cast<diy::RegularLink<Bounds>*>(cp.link());
      std::cout << "Block (" << cp.gid() << "): "
                << link->core().min[0]   << ' ' << link->core().min[1]   << ' ' << link->core().min[2] << " - "
                << link->core().max[0]   << ' ' << link->core().max[1]   << ' ' << link->core().max[2] << " : "
                << link->bounds().min[0] << ' ' << link->bounds().min[1] << ' ' << link->bounds().min[2] << " - "
                << link->bounds().max[0] << ' ' << link->bounds().max[1] << ' ' << link->bounds().max[2] << " : "
                << link->size()   << ' ' //<< std::endl
                << std::dec
                << std::endl;
    }